

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_> __thiscall
MutableS2ShapeIndex::Iterator::Clone(Iterator *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  long in_RSI;
  
  pp_Var4 = (_func_int **)operator_new(0x40);
  *pp_Var4 = (_func_int *)&PTR__IteratorBase_002bb0c0;
  pp_Var4[1] = *(_func_int **)(in_RSI + 8);
  pp_Var4[2] = *(_func_int **)(in_RSI + 0x10);
  *pp_Var4 = (_func_int *)&PTR__IteratorBase_002bb190;
  p_Var1 = *(_func_int **)(in_RSI + 0x20);
  p_Var2 = *(_func_int **)(in_RSI + 0x28);
  p_Var3 = *(_func_int **)(in_RSI + 0x30);
  pp_Var4[3] = *(_func_int **)(in_RSI + 0x18);
  pp_Var4[4] = p_Var1;
  pp_Var4[5] = p_Var2;
  pp_Var4[6] = p_Var3;
  *(undefined4 *)(pp_Var4 + 7) = *(undefined4 *)(in_RSI + 0x38);
  (this->super_IteratorBase)._vptr_IteratorBase = pp_Var4;
  return (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
          )(__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
            )this;
}

Assistant:

unique_ptr<MutableS2ShapeIndex::IteratorBase>
MutableS2ShapeIndex::Iterator::Clone() const {
  return absl::make_unique<Iterator>(*this);
}